

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_mismatch.cpp
# Opt level: O1

int main(void)

{
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  vector<int,_std::allocator<int>_> v;
  void *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_38 = (void *)0x0;
  uStack_30 = 0;
  local_28 = 0;
  pvVar1 = operator_new(8);
  lVar2 = 0;
  do {
    *(undefined4 *)((long)pvVar1 + lVar2) = 4;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 8);
  pvVar3 = operator_new(0xc);
  lVar2 = 0;
  do {
    *(undefined4 *)((long)pvVar3 + lVar2) = 4;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0xc);
  std::vector<int,std::allocator<int>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((vector<int,std::allocator<int>> *)&local_38,local_38,pvVar1,(long)pvVar3 + 0xc);
  operator_delete(pvVar3);
  operator_delete(pvVar1);
  if (local_38 != (void *)0x0) {
    operator_delete(local_38);
  }
  return 0;
}

Assistant:

int main()
{
  std::vector<int> v;
  std::vector<int> v2(2,4);
  std::vector<int> v3(3,4);

  v.insert(v.begin(), v2.begin(), v3.end());

}